

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool upb_strtable_next2(upb_strtable *t,upb_StringView *key,upb_value *val,intptr_t *iter)

{
  long *plVar1;
  uint uVar2;
  upb_tabent *puVar3;
  upb_SizePrefixString *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar6 = *iter;
  uVar5 = (ulong)((t->t).mask + 1);
  lVar7 = uVar6 * 0x18 + 0x20;
  do {
    uVar6 = uVar6 + 1;
    if (uVar5 <= uVar6) {
      uVar6 = 0xfffffffffffffffe;
      break;
    }
    plVar1 = (long *)((long)&(((t->t).entries)->val).val + lVar7);
    lVar7 = lVar7 + 0x18;
  } while (*plVar1 == 0);
  if (uVar6 < uVar5) {
    puVar3 = (t->t).entries;
    puVar4 = puVar3[uVar6].key.str;
    uVar2 = puVar4->size;
    key->data = (char *)(puVar4 + 1);
    key->size = (ulong)uVar2;
    val->val = puVar3[uVar6].val.val;
    *iter = uVar6;
  }
  return uVar6 < uVar5;
}

Assistant:

bool upb_strtable_next2(const upb_strtable* t, upb_StringView* key,
                        upb_value* val, intptr_t* iter) {
  size_t tab_idx = next(&t->t, *iter);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    *key = upb_key_strview(ent->key);
    *val = ent->val;
    *iter = tab_idx;
    return true;
  }

  return false;
}